

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * evaluate_call_expression(Scope *scope,CallExpression *call_expression)

{
  FunctionValue *function_value;
  TupleValue *parameter_values_00;
  Value *local_30;
  Value *result_value;
  Value *parameter_values;
  Value *identifier_value;
  CallExpression *call_expression_local;
  Scope *scope_local;
  
  function_value =
       (FunctionValue *)evaluate_expression(scope,call_expression->identifier_expression);
  parameter_values_00 = (TupleValue *)evaluate_expression(scope,call_expression->tuple_expression);
  local_30 = new_null_value();
  if ((parameter_values_00->value).value_type == ValueTypeTupleValue) {
    if ((function_value->value).value_type == ValueTypeFunctionValue) {
      local_30 = call_function(scope,function_value,parameter_values_00);
    }
    if ((function_value->value).value_type == ValueTypeSystemFunctionValue) {
      local_30 = call_system_function
                           (scope,(SystemFunctionValue *)function_value,parameter_values_00);
    }
  }
  free_value((Value *)function_value);
  free_value((Value *)parameter_values_00);
  return local_30;
}

Assistant:

Value *evaluate_call_expression(Scope *scope, CallExpression *call_expression) {
  Value *identifier_value = evaluate_expression(scope, call_expression->identifier_expression);
  Value *parameter_values = evaluate_expression(scope, call_expression->tuple_expression);

  Value *result_value = new_null_value();

  if (parameter_values->value_type == ValueTypeTupleValue) {
    if (identifier_value->value_type == ValueTypeFunctionValue) {
      result_value = call_function(scope, (FunctionValue *) identifier_value, (TupleValue *) parameter_values);
    }
    if (identifier_value->value_type == ValueTypeSystemFunctionValue) {
      result_value = call_system_function(scope, (SystemFunctionValue *) identifier_value, (TupleValue *) parameter_values);
    }
  }

  free_value(identifier_value);
  free_value(parameter_values);

  return result_value;
}